

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void qt_alphamapblit_quint16
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  byte bVar1;
  ulong uVar2;
  ClipLine *pCVar3;
  long lVar4;
  QT_FT_Span *pQVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uchar *puVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ushort uVar20;
  uint uVar21;
  uchar *local_70;
  uchar *local_68;
  
  if ((!useGammaCorrection) && (uVar2 = color->rgba, (short)(uVar2 >> 0x30) == -1)) {
    uVar9 = (uint)(uVar2 >> 0x15);
    uVar21 = (uint)(uVar2 >> 0x2b) & 0x1f;
    uVar20 = (ushort)uVar21 | (ushort)(uVar2 >> 0x15) & 0x7e0 | (ushort)uVar2 & 0xf800;
    if (clip == (QClipData *)0x0) {
      if (0 < mapHeight) {
        uVar13 = rasterBuffer->bytes_per_line;
        puVar11 = rasterBuffer->m_buffer + (long)x * 2 + (long)y * uVar13;
        local_70 = map;
        do {
          if (0 < mapWidth) {
            uVar19 = 0;
            do {
              bVar1 = local_70[uVar19];
              if (bVar1 != 0) {
                if (bVar1 == 0xff) {
                  *(ushort *)(puVar11 + uVar19 * 2) = uVar20;
                }
                else {
                  uVar14 = 0x100 - bVar1;
                  *(ushort *)(puVar11 + uVar19 * 2) =
                       ((ushort)((uVar14 >> 2) * (*(ushort *)(puVar11 + uVar19 * 2) & 0xf81f) >> 6)
                       & 0xf81f) +
                       ((ushort)((*(ushort *)(puVar11 + uVar19 * 2) & 0x7e0) * uVar14 >> 8) & 0x7e0)
                       + ((ushort)((bVar1 + 1 >> 2) * (uVar21 | (uint)uVar2 & 0xf800) >> 6) & 0xf81f
                         | (ushort)((bVar1 + 1) * (uVar9 & 0x7e0) >> 8) & 0x7e0);
                }
              }
              uVar19 = uVar19 + 1;
            } while ((uint)mapWidth != uVar19);
          }
          local_70 = local_70 + mapStride;
          puVar11 = puVar11 + (long)(int)(uVar13 >> 1) * 2;
          bVar6 = 1 < mapHeight;
          mapHeight = mapHeight + -1;
        } while (bVar6);
      }
    }
    else {
      uVar14 = 0;
      if (0 < y) {
        uVar14 = y;
      }
      uVar7 = mapHeight + y;
      if (rasterBuffer->m_height <= mapHeight + y) {
        uVar7 = rasterBuffer->m_height;
      }
      QClipData::initialize(clip);
      if ((int)uVar14 < (int)uVar7) {
        pCVar3 = clip->m_clipLines;
        lVar4 = rasterBuffer->bytes_per_line;
        uVar13 = (ulong)uVar14;
        local_70 = map + ((long)(int)((uVar14 - y) * mapStride) - (long)x);
        local_68 = rasterBuffer->m_buffer + lVar4 * uVar13;
        do {
          lVar12 = (long)pCVar3[uVar13].count;
          if (0 < lVar12) {
            pQVar5 = pCVar3[uVar13].spans;
            lVar15 = 0;
            do {
              iVar10 = pQVar5[lVar15].x;
              iVar8 = x;
              if (x < iVar10) {
                iVar8 = iVar10;
              }
              iVar16 = pQVar5[lVar15].len + iVar10;
              if (mapWidth + x < iVar16) {
                iVar16 = mapWidth + x;
              }
              if (iVar8 < iVar16) {
                if (iVar10 <= x) {
                  iVar10 = x;
                }
                lVar17 = (long)iVar10;
                lVar18 = 0;
                do {
                  bVar1 = local_70[lVar18 + lVar17];
                  if (bVar1 != 0) {
                    if (bVar1 == 0xff) {
                      *(ushort *)(local_68 + lVar18 * 2 + lVar17 * 2) = uVar20;
                    }
                    else {
                      uVar14 = 0x100 - bVar1;
                      *(ushort *)(local_68 + lVar18 * 2 + lVar17 * 2) =
                           ((ushort)((uVar14 >> 2) *
                                     (*(ushort *)(local_68 + lVar18 * 2 + lVar17 * 2) & 0xf81f) >> 6
                                    ) & 0xf81f) +
                           ((ushort)((*(ushort *)(local_68 + lVar18 * 2 + lVar17 * 2) & 0x7e0) *
                                     uVar14 >> 8) & 0x7e0) +
                           ((ushort)((bVar1 + 1 >> 2) * (uVar21 | (uint)uVar2 & 0xf800) >> 6) &
                            0xf81f | (ushort)((bVar1 + 1) * (uVar9 & 0x7e0) >> 8) & 0x7e0);
                    }
                  }
                  lVar18 = lVar18 + 1;
                } while (iVar16 - iVar10 != (int)lVar18);
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != lVar12);
          }
          uVar13 = uVar13 + 1;
          local_70 = local_70 + mapStride;
          local_68 = local_68 + lVar4;
        } while (uVar13 != uVar7);
      }
    }
    return;
  }
  qt_alphamapblit_generic
            (rasterBuffer,x,y,color,map,mapWidth,mapHeight,mapStride,clip,useGammaCorrection);
  return;
}

Assistant:

void qt_alphamapblit_quint16(QRasterBuffer *rasterBuffer,
                             int x, int y, const QRgba64 &color,
                             const uchar *map,
                             int mapWidth, int mapHeight, int mapStride,
                             const QClipData *clip, bool useGammaCorrection)
{
    if (useGammaCorrection || !color.isOpaque()) {
        qt_alphamapblit_generic(rasterBuffer, x, y, color, map, mapWidth, mapHeight, mapStride, clip, useGammaCorrection);
        return;
    }

    const quint16 c = color.toRgb16();

    if (!clip) {
        quint16 *dest = reinterpret_cast<quint16*>(rasterBuffer->scanLine(y)) + x;
        const int destStride = rasterBuffer->stride<quint16>();
        while (--mapHeight >= 0) {
            for (int i = 0; i < mapWidth; ++i)
                alphamapblend_quint16(map[i], dest, i, c);
            dest += destStride;
            map += mapStride;
        }
    } else {
        int top = qMax(y, 0);
        int bottom = qMin(y + mapHeight, rasterBuffer->height());
        map += (top - y) * mapStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            quint16 *dest = reinterpret_cast<quint16*>(rasterBuffer->scanLine(yp));

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];

                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);

                for (int xp=start; xp<end; ++xp)
                    alphamapblend_quint16(map[xp - x], dest, xp, c);
            } // for (i -> line.count)
            map += mapStride;
        } // for (yp -> bottom)
    }
}